

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase1273::run(TestCase1273 *this)

{
  PromiseArena *pPVar1;
  long lVar2;
  anon_class_8_1_8c041cb9_for_func aVar3;
  Promise<int> PVar4;
  __pid_t _Var5;
  void *pvVar6;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1279:36)>
  *location;
  PromiseBase location_00;
  SimpleTransformPromiseNode<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1284:26)>
  *location_01;
  bool destroyed;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_148;
  anon_class_8_1_8c041cb9_for_func local_140;
  Promise<int> promise;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_130;
  void *continuationTracePtr;
  DestructorDetector *local_120;
  size_t local_118;
  bool local_110;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  local_108;
  anon_class_8_1_8c041cb9_for_func local_100;
  WaitScope waitScope;
  EventLoop loop;
  
  destroyed = false;
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  local_100.destroyed = &destroyed;
  yield();
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1279:36)>
       ::anon_class_8_1_8c041cb9_for_func::operator();
  pPVar1 = ((local_148.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_148.ptr - (long)pPVar1) < 0x28) {
    pvVar6 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1279:36)>
                *)((long)pvVar6 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase1273::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase1273::run()::__0,void*&>
              (location,&local_148,&local_100,&continuationTracePtr);
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    ((local_148.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1279:36)>
                *)&local_148.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase1273::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase1273::run()::__0,void*&>
              (location,&local_148,&local_100,&continuationTracePtr);
    local_148.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_130.ptr = (PromiseNode *)0x0;
  local_108.ptr =
       (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t>_>
        *)0x0;
  local_140.destroyed = (bool *)location;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_130);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_148);
  local_120 = (DestructorDetector *)operator_new(8);
  aVar3.destroyed = local_140.destroyed;
  local_120->setTrue = &destroyed;
  continuationTracePtr =
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::DestructorDetector>::instance;
  pPVar1 = *(PromiseArena **)(local_140.destroyed + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_140.destroyed - (long)pPVar1) < 0x28) {
    pvVar6 = operator_new(0x400);
    location_00.node.ptr = (OwnPromiseNode)((long)pvVar6 + 0x3d8);
    ctor<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector,decltype(nullptr)>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Own<kj::(anonymous_namespace)::DestructorDetector,decltype(nullptr)>>
              ((AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t>_>
                *)location_00.node.ptr,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_140
               ,(Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t> *)
                &continuationTracePtr);
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    *(PromiseArena **)(local_140.destroyed + 8) = (PromiseArena *)0x0;
    location_00.node.ptr = (OwnPromiseNode)(local_140.destroyed + -0x28);
    ctor<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector,decltype(nullptr)>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Own<kj::(anonymous_namespace)::DestructorDetector,decltype(nullptr)>>
              ((AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t>_>
                *)location_00.node.ptr,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_140
               ,(Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t> *)
                &continuationTracePtr);
    *(PromiseArena **)(aVar3.destroyed + -0x20) = pPVar1;
  }
  local_108.ptr =
       (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t>_>
        *)0x0;
  local_130.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)location_00.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_130);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_108);
  if (local_120 != (DestructorDetector *)0x0) {
    (*(code *)**continuationTracePtr)();
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_140);
  PVar4 = promise;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1284:26)>
       ::anon_class_8_1_8c041cb9_for_func::operator();
  lVar2 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
  local_140.destroyed = &destroyed;
  if (lVar2 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar2) < 0x28) {
    pvVar6 = operator_new(0x400);
    location_01 = (SimpleTransformPromiseNode<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1284:26)>
                   *)((long)pvVar6 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<int,kj::(anonymous_namespace)::TestCase1273::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase1273::run()::__1,void*&>
              (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,&local_140,
               &continuationTracePtr);
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
    location_01 = (SimpleTransformPromiseNode<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1284:26)>
                   *)((long)promise.super_PromiseBase.node.ptr + -0x28);
    ctor<kj::_::SimpleTransformPromiseNode<int,kj::(anonymous_namespace)::TestCase1273::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase1273::run()::__1,void*&>
              (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,&local_140,
               &continuationTracePtr);
    *(long *)((long)PVar4.super_PromiseBase.node.ptr + -0x20) = lVar2;
  }
  local_130.ptr = (PromiseNode *)0x0;
  local_108.ptr =
       (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::DestructorDetector,_std::nullptr_t>_>
        *)0x0;
  local_148.ptr = (PromiseNode *)location_01;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_130);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,&local_148);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_148);
  continuationTracePtr = (void *)(CONCAT71(continuationTracePtr._1_7_,destroyed) ^ 1);
  if ((destroyed != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x509,ERROR,"\"failed: expected \" \"!(destroyed)\", _kjCondition",
               (char (*) [30])"failed: expected !(destroyed)",
               (DebugExpression<bool> *)&continuationTracePtr);
  }
  _Var5 = Promise<int>::wait(&promise,&waitScope);
  local_110 = _Var5 == 0x1bc;
  continuationTracePtr = (void *)CONCAT44(_Var5,0x1bc);
  local_120 = (DestructorDetector *)0x3d3269;
  local_118 = 5;
  if (kj::_::Debug::minSeverity < 3 && !local_110) {
    local_130.ptr._0_4_ = 0x1bc;
    _Var5 = Promise<int>::wait(&promise,&waitScope);
    local_108.ptr._0_4_ = _Var5;
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x50a,ERROR,
               "\"failed: expected \" \"(444) == (promise.wait(waitScope))\", _kjCondition, 444, promise.wait(waitScope)"
               ,(char (*) [52])"failed: expected (444) == (promise.wait(waitScope))",
               (DebugComparison<int,_int> *)&continuationTracePtr,(int *)&local_130,
               (int *)&local_108);
  }
  continuationTracePtr = &destroyed;
  if ((destroyed == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x50b,ERROR,"\"failed: expected \" \"destroyed\", _kjCondition",
               (char (*) [27])"failed: expected destroyed",
               (DebugExpression<bool_&> *)&continuationTracePtr);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, Attach) {
  bool destroyed = false;

  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() {
    EXPECT_FALSE(destroyed);
    return 123;
  }).attach(kj::heap<DestructorDetector>(destroyed));

  promise = promise.then([&](int i) {
    EXPECT_TRUE(destroyed);
    return i + 321;
  });

  EXPECT_FALSE(destroyed);
  EXPECT_EQ(444, promise.wait(waitScope));
  EXPECT_TRUE(destroyed);
}